

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O1

size_t IpmiFruWriteMultirecords(FILE *ofd,Exp_EEP_t *exp_eep,uint dynamic_offset,size_t size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined6 uVar31;
  undefined1 uVar19;
  undefined1 uVar21;
  bool bVar22;
  uint uVar23;
  Exp_EEP_t *pEVar24;
  byte bVar25;
  bool bVar26;
  uint uVar27;
  size_t sVar28;
  int iVar29;
  size_t __n;
  ulong uVar30;
  uint8_t block_id;
  byte local_69;
  uint local_68;
  uint local_64;
  size_t local_60;
  size_t local_58;
  uint local_50;
  uint local_4c;
  size_t local_48;
  FILE *local_40;
  Exp_EEP_t *local_38;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined5 uVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined3 uVar9;
  undefined1 uVar10;
  undefined2 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined3 uVar15;
  undefined1 uVar16;
  undefined2 uVar17;
  undefined1 uVar18;
  undefined2 uVar20;
  
  local_40 = ofd;
  if (*(int *)exp_eep->GenId == 0x306d6f43) {
    if (verbose == '\x01') {
      puts("Encoding COM-Express Carrier description");
    }
    multirecord.data[0x30] = exp_eep[3].EeePHdr.DontCareByte;
    multirecord.data[0] = (exp_eep->EeePHdr).DontCareByte;
    multirecord.data[1] = (exp_eep->EeePHdr).EepId[0];
    multirecord.data[2] = (exp_eep->EeePHdr).EepId[1];
    multirecord.data[3] = (exp_eep->EeePHdr).SpecRev;
    multirecord.data[4] = (exp_eep->EeePHdr).BlkOffset;
    multirecord.data[5] = (exp_eep->EeePHdr).DeviceDesc;
    multirecord.data[6] = exp_eep->GenId[0];
    multirecord.data[7] = exp_eep->GenId[1];
    uVar31._0_1_ = exp_eep[1].EeePHdr.DontCareByte;
    uVar31._1_1_ = exp_eep[1].EeePHdr.EepId[0];
    uVar13 = exp_eep[1].EeePHdr.EepId[1];
    uVar14 = exp_eep[1].EeePHdr.SpecRev;
    uVar16 = exp_eep[1].EeePHdr.BlkOffset;
    uVar18 = exp_eep[1].EeePHdr.DeviceDesc;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar31._2_4_ = CONCAT31(uVar15,uVar13);
    uVar19 = exp_eep[1].GenId[0];
    uVar21 = exp_eep[1].GenId[1];
    uVar20 = CONCAT11(uVar21,uVar19);
    multirecord.data[0x20] = exp_eep[2].EeePHdr.DontCareByte;
    multirecord.data[0x21] = exp_eep[2].EeePHdr.EepId[0];
    multirecord.data[0x22] = exp_eep[2].EeePHdr.EepId[1];
    multirecord.data[0x23] = exp_eep[2].EeePHdr.SpecRev;
    multirecord.data[0x24] = exp_eep[2].EeePHdr.BlkOffset;
    multirecord.data[0x25] = exp_eep[2].EeePHdr.DeviceDesc;
    multirecord.data[0x26] = exp_eep[2].GenId[0];
    multirecord.data[0x27] = exp_eep[2].GenId[1];
    multirecord.data._40_8_ = *(undefined8 *)(exp_eep[2].GenId + 2);
    multirecord.data._16_2_ = SUB62(uVar31,0);
    multirecord.data._24_6_ = SUB86(*(undefined8 *)(exp_eep[1].GenId + 2),0);
    multirecord.data._30_2_ = SUB82((ulong)*(undefined8 *)(exp_eep[1].GenId + 2) >> 0x30,0);
    multirecord.data._8_6_ = SUB86(*(undefined8 *)(exp_eep->GenId + 2),0);
    multirecord.data._14_2_ = SUB82((ulong)*(undefined8 *)(exp_eep->GenId + 2) >> 0x30,0);
    bVar25 = 0x35;
    multirecord.header.common_header.length = '6';
    multirecord.data._18_4_ = uVar31._2_4_;
    multirecord.data._22_2_ = uVar20;
  }
  else if (*(int *)exp_eep->GenId == 0x486d6f43) {
    if (verbose == '\x01') {
      puts("Encoding COM-HPC Carrier description");
    }
    memcpy(multirecord.data,exp_eep,0x4f);
    bVar25 = 0x35;
    multirecord.header.common_header.length = 'T';
  }
  else if (*(int *)exp_eep->GenId == 0x304d6f63) {
    if (verbose == '\x01') {
      puts("Encoding COM-Express Module description");
    }
    multirecord.data[0x10] = exp_eep[1].EeePHdr.DontCareByte;
    multirecord.data[0x11] = exp_eep[1].EeePHdr.EepId[0];
    multirecord.data[0] = (exp_eep->EeePHdr).DontCareByte;
    multirecord.data[1] = (exp_eep->EeePHdr).EepId[0];
    multirecord.data[2] = (exp_eep->EeePHdr).EepId[1];
    multirecord.data[3] = (exp_eep->EeePHdr).SpecRev;
    multirecord.data[4] = (exp_eep->EeePHdr).BlkOffset;
    multirecord.data[5] = (exp_eep->EeePHdr).DeviceDesc;
    multirecord.data[6] = exp_eep->GenId[0];
    multirecord.data[7] = exp_eep->GenId[1];
    multirecord.data._8_6_ = SUB86(*(undefined8 *)(exp_eep->GenId + 2),0);
    multirecord.data._14_2_ = SUB82((ulong)*(undefined8 *)(exp_eep->GenId + 2) >> 0x30,0);
    bVar25 = 0x36;
    multirecord.header.common_header.length = '\x17';
  }
  else {
    bVar26 = false;
    if (*(int *)exp_eep->GenId != 0x484d6f63) goto LAB_00101817;
    if (verbose == '\x01') {
      puts("Encoding COM-HPC Module description");
    }
    multirecord.data[0] = (exp_eep->EeePHdr).DontCareByte;
    multirecord.data[1] = (exp_eep->EeePHdr).EepId[0];
    multirecord.data[2] = (exp_eep->EeePHdr).EepId[1];
    multirecord.data[3] = (exp_eep->EeePHdr).SpecRev;
    multirecord.data[4] = (exp_eep->EeePHdr).BlkOffset;
    multirecord.data[5] = (exp_eep->EeePHdr).DeviceDesc;
    multirecord.data[6] = exp_eep->GenId[0];
    multirecord.data[7] = exp_eep->GenId[1];
    uVar1 = *(undefined8 *)&(exp_eep->DevId).DeviceFlav;
    uVar2._0_1_ = exp_eep[1].GenId[0];
    uVar2._1_1_ = exp_eep[1].GenId[1];
    uVar3 = exp_eep[1].GenId[2];
    uVar4 = exp_eep[1].GenId[3];
    uVar6 = exp_eep[1].DevId.VendId[0];
    uVar8 = exp_eep[1].DevId.VendId[1];
    uVar10 = exp_eep[1].DevId.DeviceId[0];
    uVar12 = exp_eep[1].DevId.DeviceId[1];
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar7 = CONCAT31(uVar9,uVar6);
    uVar5 = CONCAT41(uVar7,uVar4);
    uVar2._2_6_ = CONCAT51(uVar5,uVar3);
    multirecord.data._16_2_ = SUB82((ulong)uVar1 >> 0x10,0);
    multirecord.data._18_4_ = SUB84((ulong)uVar1 >> 0x20,0);
    multirecord.data._22_2_ = SUB82(uVar2,0);
    multirecord.data._8_6_ = SUB86(*(undefined8 *)(exp_eep->GenId + 2),0);
    multirecord.data._14_2_ = SUB82((ulong)*(undefined8 *)(exp_eep->GenId + 2) >> 0x30,0);
    bVar25 = 0x36;
    multirecord.header.common_header.length = '#';
    multirecord.data._24_6_ = uVar2._2_6_;
  }
  multirecord.header.common_header.type_id = 0xc0;
  multirecord.header.common_header.format_version = '\x02';
  multirecord.header.common_header.record_checksum = '\0';
  multirecord.header.common_header.header_checksum = '\0';
  multirecord.header.manufacturer_id[0] = 'Z';
  multirecord.header.manufacturer_id[1] = '1';
  multirecord.header._7_2_ = (ushort)bVar25 << 8;
  multirecord.header.picmg_format_version = '\0';
  bVar26 = true;
LAB_00101817:
  local_60 = 0;
  local_68 = 0;
  local_48 = size;
  local_38 = exp_eep;
  do {
    pEVar24 = local_38;
    if (size <= dynamic_offset) {
      if (!bVar26) {
        return local_60;
      }
      sVar28 = IpmiFruWritePreparedMultirecord(local_40,1);
      if ((int)(uint)sVar28 < 1) {
        return 0xffffffffffffffff;
      }
      return local_60 + ((uint)sVar28 & 0x7fffffff);
    }
    local_58 = ParseDynamic(local_38,dynamic_offset,size,&local_69);
    uVar23 = local_68;
    uVar27 = (uint)local_58;
    if ((int)uVar27 < 1) {
      bVar22 = false;
      fprintf(_stderr,"Failed to parse a dynamic record at offset %d\n",(ulong)dynamic_offset);
    }
    else {
      if ((local_69 != 0) && (local_69 != 0xf2)) {
        bVar26 = !bVar26;
        local_50 = local_68 & 0xffff;
        iVar29 = 0;
        local_64 = dynamic_offset;
        local_4c = (uint)local_69;
        do {
          if (!bVar26) {
            bVar22 = false;
            sVar28 = IpmiFruWritePreparedMultirecord(local_40,0);
            if ((int)(uint)sVar28 < 1) goto LAB_00101980;
            local_60 = local_60 + ((uint)sVar28 & 0x7fffffff);
          }
          uVar30 = (ulong)(uVar27 & 0x7fffffff) - (long)iVar29;
          __n = 0xf8;
          if (uVar30 < 0xf8) {
            __n = uVar30;
          }
          multirecord.data[1] = (uint8_t)(uVar23 >> 8);
          multirecord.data[0] = (uint8_t)local_68;
          memcpy(multirecord.data + 2,
                 (pEVar24->EeePHdr).EepId + (long)iVar29 + (ulong)dynamic_offset + -1,__n);
          multirecord.header.common_header.type_id = 0xc0;
          multirecord.header.common_header.format_version = '\x02';
          multirecord.header.common_header.length = (char)__n + '\a';
          multirecord.header.common_header.record_checksum = '\0';
          multirecord.header.common_header.header_checksum = '\0';
          multirecord.header.manufacturer_id[0] = 'Z';
          multirecord.header.manufacturer_id[1] = '1';
          multirecord.header.manufacturer_id[2] = '\0';
          multirecord.header.picmg_record_id = '7';
          multirecord.header.picmg_format_version = '\0';
          if (verbose == '\x01') {
            printf("Encoding dynamic block %x, size=%d, offset=%d, instance=%d, last piece=%d\n",
                   (ulong)local_4c,local_58,(ulong)local_64,(ulong)local_50,(ulong)(uVar30 < 0xf9));
          }
          iVar29 = iVar29 + (int)__n;
          bVar26 = false;
        } while (0xf8 < uVar30);
        local_68 = local_68 + 1;
        bVar22 = true;
LAB_00101980:
        bVar26 = true;
        size = local_48;
        dynamic_offset = local_64;
        if (!bVar22) {
          bVar22 = false;
          goto LAB_0010199c;
        }
      }
      dynamic_offset = dynamic_offset + (int)local_58;
      bVar22 = true;
    }
LAB_0010199c:
    if (!bVar22) {
      return 0xffffffffffffffff;
    }
  } while( true );
}

Assistant:

size_t IpmiFruWriteMultirecords(FILE *ofd, Exp_EEP_t *exp_eep, unsigned int dynamic_offset, size_t size)
{
    size_t acc_size = 0;
    int res;
    BOOL multirecord_present = FALSE;
    
    if (memcmp(exp_eep->GenId, "Com0", 4) == 0) {
        //  Encode Com0 carrier record
        if (verbose) printf("Encoding COM-Express Carrier description\n");
        IpmiFruEncodeCarrier(exp_eep, sizeof(COM0R20_CB_t));
        multirecord_present = TRUE;
    } else if (memcmp(exp_eep->GenId, "ComH", 4) == 0) {
        //  Encode ComH carrier record
        if (verbose) printf("Encoding COM-HPC Carrier description\n");
        IpmiFruEncodeCarrier(exp_eep, sizeof(COMHR10_CB_t));
        multirecord_present = TRUE;
    } else if (memcmp(exp_eep->GenId, "coM0", 4) == 0) {
        //  Encode Com0 module record
        if (verbose) printf("Encoding COM-Express Module description\n");
        IpmiFruEncodeModule(exp_eep, sizeof(COM0R20_M_t));
        multirecord_present = TRUE;
    } else if (memcmp(exp_eep->GenId, "coMH", 4) == 0) {
        //  Encode ComH module record
        if (verbose) printf("Encoding COM-HPC Module description\n");
        IpmiFruEncodeModule(exp_eep, sizeof(COMHR10_M_t));
        multirecord_present = TRUE;
    }
    //  Now encode dynamic records
    uint16_t instance_id = 0;
    while (dynamic_offset < size) {
        uint8_t block_id;
        int next_size = ParseDynamic(exp_eep, dynamic_offset, size, &block_id);
        if (next_size <= 0) {
            fprintf(stderr, "Failed to parse a dynamic record at offset %d\n", dynamic_offset);
            return -1;
        }
        if(block_id != EEEP_BLOCK_ID_UNUSED && block_id != EEEP_BLOCK_ID_CRC_CHK) {
            int piece_offset = 0;
            BOOL last_piece;
            do {
                if (multirecord_present) {
                    if ((res = IpmiFruWritePreparedMultirecord(ofd, FALSE)) <= 0) {                
                        return -1;
                    }
                    acc_size += res;
                }
                last_piece = IpmiFruEncodeDynamic(exp_eep, dynamic_offset, next_size, 
                    instance_id, &piece_offset); 
                if (verbose) printf("Encoding dynamic block %x, size=%d, offset=%d, instance=%d, last piece=%d\n", 
                        block_id, next_size, dynamic_offset, instance_id, last_piece);
                multirecord_present = TRUE;
            } while (!last_piece);
            instance_id ++;
        }
        dynamic_offset += next_size;
    }
    //  Write last record 
    if (multirecord_present) {
        if ((res = IpmiFruWritePreparedMultirecord(ofd, TRUE)) <= 0) {                
            return -1;
        }
        acc_size += res;
    }
    return acc_size;
}